

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KFilter.cpp
# Opt level: O0

void __thiscall KFilter::KFilter(KFilter *this,int state_dimension,int measurement_dimension)

{
  IdentityReturnType local_b8;
  IdentityReturnType local_a0;
  IdentityReturnType local_88;
  IdentityReturnType local_70;
  IdentityReturnType local_58;
  ConstantReturnType local_40;
  int local_18;
  int local_14;
  int measurement_dimension_local;
  int state_dimension_local;
  KFilter *this_local;
  
  local_18 = measurement_dimension;
  local_14 = state_dimension;
  _measurement_dimension_local = this;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->F_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->x_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Q_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->H_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->R_);
  this->measurement_dimension_ = local_18;
  this->state_dimension_ = local_14;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_40,(long)local_14);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->x_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_40);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            (&local_58,(long)local_14,(long)local_14);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)this,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_58);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            (&local_70,(long)local_14,(long)local_14);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->P_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_70);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            (&local_88,(long)local_14,(long)local_14);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->Q_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_88);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            (&local_a0,(long)local_14,(long)local_18);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->H_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_a0);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            (&local_b8,(long)local_18,(long)local_18);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->R_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_b8);
  return;
}

Assistant:

KFilter::KFilter(int state_dimension, int measurement_dimension) : 
    state_dimension_(state_dimension), 
    measurement_dimension_(measurement_dimension)
{
    // Initialize all matrices to correct size and default values
    // We'll directly set since we know these dimensions are valid
    x_ = VectorXd::Zero(state_dimension);
    F_ = MatrixXd::Identity(state_dimension, state_dimension);
    P_ = MatrixXd::Identity(state_dimension, state_dimension);
    Q_ = MatrixXd::Identity(state_dimension, state_dimension);
    H_ = MatrixXd::Identity(state_dimension, measurement_dimension);
    R_ = MatrixXd::Identity(measurement_dimension, measurement_dimension);
}